

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commitment_to_pubkey
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,secp256k1_pedersen_commitment *commit
              )

{
  byte *in_RDX;
  void *in_RSI;
  secp256k1_fe fe;
  secp256k1_ge Q;
  secp256k1_ge *in_stack_ffffffffffffff58;
  secp256k1_ge *in_stack_ffffffffffffff60;
  secp256k1_ge *in_stack_ffffffffffffff98;
  secp256k1_pubkey *in_stack_ffffffffffffffa0;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == (byte *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else {
      secp256k1_fe_set_b32((secp256k1_fe *)&stack0xffffffffffffff60,in_RDX + 1);
      secp256k1_ge_set_xquad(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if ((*in_RDX & 1) != 0) {
        secp256k1_ge_neg(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      secp256k1_pubkey_save(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      secp256k1_ge_clear((secp256k1_ge *)0x10bc93);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_commitment_to_pubkey(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const secp256k1_pedersen_commitment* commit) {
    secp256k1_ge Q;
    secp256k1_fe fe;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(commit != NULL);

    secp256k1_fe_set_b32(&fe, &commit->data[1]);
    secp256k1_ge_set_xquad(&Q, &fe);
    if (commit->data[0] & 1) {
        secp256k1_ge_neg(&Q, &Q);
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}